

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O1

void setpath(lua_State *L,char *fieldname,char *envname,char *def)

{
  char *pcVar1;
  
  pcVar1 = getenv(envname);
  if (pcVar1 == (char *)0x0) {
    lua_pushstring(L,def);
  }
  else {
    pcVar1 = luaL_gsub(L,pcVar1,";;",";\x01;");
    luaL_gsub(L,pcVar1,"\x01",def);
    lua_remove(L,-2);
  }
  lua_setfield(L,-2,fieldname);
  return;
}

Assistant:

static void setpath (lua_State *L, const char *fieldname, const char *envname,
                                   const char *def) {
  const char *path = getenv(envname);
  if (path == NULL)  /* no environment variable? */
    lua_pushstring(L, def);  /* use default */
  else {
    /* replace ";;" by ";AUXMARK;" and then AUXMARK by default path */
    path = luaL_gsub(L, path, LUA_PATHSEP LUA_PATHSEP,
                              LUA_PATHSEP AUXMARK LUA_PATHSEP);
    luaL_gsub(L, path, AUXMARK, def);
    lua_remove(L, -2);
  }
  setprogdir(L);
  lua_setfield(L, -2, fieldname);
}